

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

double __thiscall crsGA::Logger::log(Logger *this,double __x)

{
  bool bVar1;
  undefined8 in_R8;
  double extraout_XMM0_Qa;
  undefined1 local_70 [8];
  LogMessage logMessage;
  string *entry_local;
  int line_local;
  char *file_local;
  LogLevel logLevel_local;
  Logger *this_local;
  
  logMessage.msg.field_2._8_8_ = in_R8;
  LogMessage::LogMessage((LogMessage *)local_70);
  std::__cxx11::string::operator=((string *)&logMessage.line,(string *)logMessage.msg.field_2._8_8_)
  ;
  logMessage._0_8_ = std::chrono::_V2::system_clock::now();
  bVar1 = std::thread::joinable(&this->_thread);
  if (bVar1) {
    ThreadSafeQueue<crsGA::Logger::LogMessage>::push(&this->_queue,(LogMessage *)local_70);
  }
  else {
    dispatchLogMessage(this,(LogMessage *)local_70);
  }
  LogMessage::~LogMessage((LogMessage *)local_70);
  return extraout_XMM0_Qa;
}

Assistant:

void Logger::log(LogLevel logLevel, const char* file, int line, const std::string& entry)
{
    LogMessage logMessage;
    logMessage.file = file;
    logMessage.line = line;
    logMessage.level = logLevel;
    logMessage.msg = entry;
    logMessage.when = std::chrono::system_clock::now();
    if (_thread.joinable())
        _queue.push(std::move(logMessage));
    else
        dispatchLogMessage(logMessage);
}